

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O1

size_t brotli::RemapBlockIds(uint8_t *block_ids,size_t length)

{
  byte *__k;
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
  new_id;
  _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_char,_unsigned_char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sVar7 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (length != 0) {
    sVar6 = 0;
    sVar7 = 0;
    do {
      __k = block_ids + sVar6;
      p_Var2 = &p_Var1->_M_header;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          bVar8 = (byte)*(size_t *)(p_Var4 + 1) < *__k;
          if (!bVar8) {
            p_Var2 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[bVar8];
        } while (p_Var4 != (_Base_ptr)0x0);
      }
      p_Var5 = p_Var1;
      if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
         (p_Var5 = (_Rb_tree_header *)p_Var2,
         *__k < (byte)((_Rb_tree_header *)p_Var2)->_M_node_count)) {
        p_Var5 = p_Var1;
      }
      if (p_Var5 == p_Var1) {
        pmVar3 = std::
                 map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                 ::operator[]((map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                               *)&local_60,__k);
        *pmVar3 = (mapped_type)sVar7;
        sVar7 = sVar7 + 1;
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != length);
  }
  if (length != 0) {
    do {
      pmVar3 = std::
               map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
               ::operator[]((map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                             *)&local_60,block_ids);
      *block_ids = *pmVar3;
      block_ids = block_ids + 1;
      length = length - 1;
    } while (length != 0);
  }
  std::
  _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_char,_unsigned_char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
  ::~_Rb_tree(&local_60);
  return sVar7;
}

Assistant:

size_t RemapBlockIds(uint8_t* block_ids, const size_t length) {
  std::map<uint8_t, uint8_t> new_id;
  size_t next_id = 0;
  for (size_t i = 0; i < length; ++i) {
    if (new_id.find(block_ids[i]) == new_id.end()) {
      new_id[block_ids[i]] = static_cast<uint8_t>(next_id);
      ++next_id;
    }
  }
  for (size_t i = 0; i < length; ++i) {
    block_ids[i] = new_id[block_ids[i]];
  }
  return next_id;
}